

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool CheckChecksum(Span<const_char> *sp,bool require_checksum,string *error,string *out_checksum)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  Span<const_char> *span;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> check_split;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string checksum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  util::Split<Span<char_const>>(&check_split,(util *)sp,(Span<const_char> *)0x23,(char)out_checksum)
  ;
  uVar4 = (long)check_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)check_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < 0x21) {
    if (require_checksum && uVar4 == 0x10) {
      __s = "Missing checksum";
      goto LAB_00aa464b;
    }
    if ((uVar4 != 0x20) ||
       ((pointer)check_split.
                 super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                 super__Vector_impl_data._M_start[1].m_size == (pointer)0x8)) {
      (anonymous_namespace)::DescriptorChecksum_abi_cxx11_
                (&checksum,
                 (_anonymous_namespace_ *)
                 check_split.
                 super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                 super__Vector_impl_data._M_start,span);
      if (checksum._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (error,"Invalid characters in payload");
LAB_00aa479b:
        bVar3 = false;
      }
      else {
        if ((long)check_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)check_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x20) {
          bVar3 = std::__equal<true>::equal<char>
                            (checksum._M_dataplus._M_p,
                             checksum._M_dataplus._M_p + checksum._M_string_length,
                             check_split.
                             super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data);
          if (!bVar3) {
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,
                       check_split.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].m_data,
                       check_split.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].m_data +
                       check_split.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].m_size);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_70,
                       (tinyformat *)
                       "Provided checksum \'%s\' does not match computed checksum \'%s\'",
                       (char *)local_90,&checksum,in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)local_90);
            goto LAB_00aa479b;
          }
        }
        if (out_checksum != (string *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (out_checksum,&checksum);
        }
        sVar2 = (check_split.
                 super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                 super__Vector_impl_data._M_start)->m_size;
        sp->m_data = (check_split.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_data;
        sp->m_size = sVar2;
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)&checksum);
      goto LAB_00aa4655;
    }
    local_70._M_dataplus._M_p =
         (pointer)check_split.
                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
                  super__Vector_impl_data._M_start[1].m_size;
    tinyformat::format<unsigned_long>
              (&checksum,"Expected 8 character checksum, not %u characters",
               (unsigned_long *)&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,&checksum);
    std::__cxx11::string::~string((string *)&checksum);
  }
  else {
    __s = "Multiple \'#\' symbols";
LAB_00aa464b:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,__s);
  }
  bVar3 = false;
LAB_00aa4655:
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base
            (&check_split.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckChecksum(Span<const char>& sp, bool require_checksum, std::string& error, std::string* out_checksum = nullptr)
{
    auto check_split = Split(sp, '#');
    if (check_split.size() > 2) {
        error = "Multiple '#' symbols";
        return false;
    }
    if (check_split.size() == 1 && require_checksum){
        error = "Missing checksum";
        return false;
    }
    if (check_split.size() == 2) {
        if (check_split[1].size() != 8) {
            error = strprintf("Expected 8 character checksum, not %u characters", check_split[1].size());
            return false;
        }
    }
    auto checksum = DescriptorChecksum(check_split[0]);
    if (checksum.empty()) {
        error = "Invalid characters in payload";
        return false;
    }
    if (check_split.size() == 2) {
        if (!std::equal(checksum.begin(), checksum.end(), check_split[1].begin())) {
            error = strprintf("Provided checksum '%s' does not match computed checksum '%s'", std::string(check_split[1].begin(), check_split[1].end()), checksum);
            return false;
        }
    }
    if (out_checksum) *out_checksum = std::move(checksum);
    sp = check_split[0];
    return true;
}